

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssl_shim.cc
# Opt level: O0

bool CheckHandshakeProperties(SSL *ssl,bool is_resume,TestConfig *config)

{
  byte bVar1;
  ushort uVar2;
  FILE *pFVar3;
  uint8_t *puVar4;
  bool bVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint uVar8;
  int iVar9;
  ssl_early_data_reason_t reason;
  int32_t iVar10;
  SSL_CIPHER *pSVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  size_t sVar14;
  undefined8 uVar15;
  stack_st_X509 *psVar16;
  int *piVar17;
  uint *puVar18;
  char *pcVar19;
  string_view s;
  string_view s_00;
  string_view s_01;
  undefined1 auVar20 [16];
  Span<const_unsigned_char> lhs;
  UniquePtr<SSL_SESSION> *local_228;
  bool local_20a;
  byte local_209;
  bool local_1fa;
  bool local_1f9;
  bool private_key_allowed;
  char *early_data_reason;
  undefined1 auStack_1d8 [4];
  uint16_t cipher_id;
  uint16_t curve_id;
  Span<const_unsigned_char> local_1c8;
  uint8_t local_1b8 [8];
  uint8_t channel_id [64];
  Span<const_unsigned_char> local_168;
  size_t local_158;
  size_t peer_params_len;
  uint8_t *peer_params;
  Span<const_unsigned_char> local_140;
  undefined1 local_130 [16];
  Span<const_unsigned_char> local_120;
  size_t local_110;
  size_t peer_settings_len;
  uint8_t *peer_settings;
  byte local_ea;
  allocator<char> local_e9;
  string local_e8 [8];
  string expect_settings;
  uint local_94;
  uchar *puStack_90;
  uint alpn_proto_len;
  uint8_t *alpn_proto;
  string *expect_alpn;
  undefined1 local_70 [16];
  Span<const_unsigned_char> local_60;
  uint local_4c;
  uchar *puStack_48;
  uint next_proto_len;
  uint8_t *next_proto;
  char *server_name;
  bool expect_new_session;
  bool expect_handshake_done;
  TestState *pTStack_30;
  bool expect_resume;
  TestState *state;
  TestConfig *config_local;
  SSL *pSStack_18;
  bool is_resume_local;
  SSL *ssl_local;
  
  state = (TestState *)config;
  config_local._7_1_ = is_resume;
  pSStack_18 = (SSL *)ssl;
  pTStack_30 = GetTestState(ssl);
  bVar5 = CheckAuthProperties((SSL *)pSStack_18,(bool)(config_local._7_1_ & 1),(TestConfig *)state);
  if (!bVar5) {
    ssl_local._7_1_ = 0;
    goto LAB_00123c5b;
  }
  pSVar11 = SSL_get_current_cipher(pSStack_18);
  if (pSVar11 == (SSL_CIPHER *)0x0) {
    fprintf(_stderr,"null cipher after handshake\n");
    ssl_local._7_1_ = 0;
    goto LAB_00123c5b;
  }
  if ((*(short *)((long)&state[5].get_handshake_hints_cb.super__Function_base._M_functor + 4) != 0)
     && (uVar8 = SSL_version(pSStack_18), pFVar3 = _stderr,
        uVar8 != *(ushort *)
                  ((long)&state[5].get_handshake_hints_cb.super__Function_base._M_functor + 4))) {
    uVar2 = *(ushort *)((long)&state[5].get_handshake_hints_cb.super__Function_base._M_functor + 4);
    uVar8 = SSL_version(pSStack_18);
    fprintf(pFVar3,"want version %04x, got %04x\n",(ulong)uVar2,(ulong)(uVar8 & 0xffff));
    ssl_local._7_1_ = 0;
    goto LAB_00123c5b;
  }
  local_1f9 = false;
  if ((config_local._7_1_ & 1) != 0) {
    local_1fa = true;
    if ((state[4].selected_credential & 1) != 0) {
      iVar9 = SSL_in_early_data((SSL *)pSStack_18);
      local_1fa = iVar9 != 0;
    }
    local_1f9 = local_1fa;
  }
  server_name._7_1_ = local_1f9;
  iVar9 = SSL_session_reused((SSL *)pSStack_18);
  pFVar3 = _stderr;
  if ((iVar9 != 0) != (bool)(server_name._7_1_ & 1)) {
    iVar9 = SSL_session_reused((SSL *)pSStack_18);
    pcVar19 = " not";
    if (iVar9 != 0) {
      pcVar19 = "";
    }
    fprintf(pFVar3,"session unexpectedly was%s reused\n",pcVar19);
    ssl_local._7_1_ = 0;
    goto LAB_00123c5b;
  }
  if (((config_local._7_1_ & 1) != 0) ||
     (local_209 = 0,
     ((ulong)state[2].get_handshake_hints_cb.super__Function_base._M_manager & 0x100) == 0)) {
    iVar9 = SSL_in_early_data((SSL *)pSStack_18);
    local_209 = iVar9 != 0 ^ 0xff;
  }
  server_name._6_1_ = local_209 & 1;
  if (server_name._6_1_ != (pTStack_30->handshake_done & 1U)) {
    pcVar19 = " not";
    if ((pTStack_30->handshake_done & 1U) != 0) {
      pcVar19 = "";
    }
    fprintf(_stderr,"handshake was%s completed\n",pcVar19);
    ssl_local._7_1_ = 0;
    goto LAB_00123c5b;
  }
  if ((server_name._6_1_ != 0) &&
     (((ulong)(state->quic_transport)._M_t.
              super___uniq_ptr_impl<MockQuicTransport,_std::default_delete<MockQuicTransport>_>._M_t
              .super__Tuple_impl<0UL,_MockQuicTransport_*,_std::default_delete<MockQuicTransport>_>.
              super__Head_base<0UL,_MockQuicTransport_*,_false>._M_head_impl & 1) == 0)) {
    local_20a = false;
    if ((((ulong)state[6].private_key_result.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage & 0x1000000) == 0) &&
       ((iVar9 = SSL_session_reused((SSL *)pSStack_18), iVar9 == 0 ||
        (local_20a = false,
        ((ulong)state[6].private_key_result.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage & 0x10000) != 0)))) {
      uVar6 = GetProtocolVersion((SSL *)pSStack_18);
      local_20a = uVar6 < 0x304;
    }
    server_name._5_1_ = local_20a;
    if (local_20a != (bool)(pTStack_30->got_new_session & 1U)) {
      pcVar19 = " not";
      if ((pTStack_30->got_new_session & 1U) != 0) {
        pcVar19 = "";
      }
      fprintf(_stderr,"new session was%s cached, but we expected the opposite\n",pcVar19);
      ssl_local._7_1_ = 0;
      goto LAB_00123c5b;
    }
  }
  if ((config_local._7_1_ & 1) == 0) {
    if (((state[7].msg_callback_text.field_2._M_local_buf[4] & 1U) != 0) &&
       ((pTStack_30->got_new_session & 1U) == 0)) {
      fprintf(_stderr,"session was not cached on the server.\n");
      ssl_local._7_1_ = 0;
      goto LAB_00123c5b;
    }
    if (((state[7].msg_callback_text.field_2._M_local_buf[5] & 1U) != 0) &&
       ((pTStack_30->got_new_session & 1U) != 0)) {
      fprintf(_stderr,"session was unexpectedly cached on the server.\n");
      ssl_local._7_1_ = 0;
      goto LAB_00123c5b;
    }
  }
  if (((((ulong)state[7].get_handshake_hints_cb._M_invoker & 0x100) == 0) &&
      (((ulong)(state->quic_transport)._M_t.
               super___uniq_ptr_impl<MockQuicTransport,_std::default_delete<MockQuicTransport>_>.
               _M_t.
               super__Tuple_impl<0UL,_MockQuicTransport_*,_std::default_delete<MockQuicTransport>_>.
               super__Head_base<0UL,_MockQuicTransport_*,_false>._M_head_impl & 1) != 0)) &&
     ((pTStack_30->early_callback_called & 1U) == 0)) {
    fprintf(_stderr,"early callback not called\n");
    ssl_local._7_1_ = 0;
    goto LAB_00123c5b;
  }
  uVar12 = std::__cxx11::string::empty();
  if (((uVar12 & 1) == 0) &&
     ((next_proto = (uint8_t *)SSL_get_servername(pSStack_18,0), next_proto == (uint8_t *)0x0 ||
      (bVar5 = std::operator!=((char *)next_proto,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &state[1].private_key), bVar5)))) {
    puVar4 = next_proto;
    pFVar3 = _stderr;
    uVar15 = std::__cxx11::string::c_str();
    fprintf(pFVar3,"servername mismatch (got %s; want %s)\n",puVar4,uVar15);
    ssl_local._7_1_ = 0;
    goto LAB_00123c5b;
  }
  uVar12 = std::__cxx11::string::empty();
  if (((uVar12 & 1) == 0) ||
     (((ulong)state[2].get_handshake_hints_cb.super__Function_base._M_manager & 1) != 0)) {
    SSL_get0_next_proto_negotiated(pSStack_18,&stack0xffffffffffffffb8,&local_4c);
    local_70 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(state[2].msg_callback_text.field_2._M_local_buf + 8));
    s._M_str = local_70._8_8_;
    s._M_len = (size_t)s._M_str;
    local_60 = bssl::StringAsBytes(local_70._0_8_,s);
    bssl::Span<const_unsigned_char>::Span
              ((Span<const_unsigned_char> *)&expect_alpn,puStack_48,(ulong)local_4c);
    bVar5 = bssl::internal::operator!=(local_60,_expect_alpn);
    if (bVar5) {
      fprintf(_stderr,"negotiated next proto mismatch\n");
      ssl_local._7_1_ = 0;
      goto LAB_00123c5b;
    }
  }
  if (((ulong)(state->quic_transport)._M_t.
              super___uniq_ptr_impl<MockQuicTransport,_std::default_delete<MockQuicTransport>_>._M_t
              .super__Tuple_impl<0UL,_MockQuicTransport_*,_std::default_delete<MockQuicTransport>_>.
              super__Head_base<0UL,_MockQuicTransport_*,_false>._M_head_impl & 1) == 0) {
    local_228 = (UniquePtr<SSL_SESSION> *)
                (state[3].get_handshake_hints_cb.super__Function_base._M_functor._M_pod_data + 8);
  }
  else {
    local_228 = &state[4].session;
  }
  alpn_proto = (uint8_t *)local_228;
  SSL_get0_alpn_selected((SSL *)pSStack_18,&stack0xffffffffffffff70,&local_94);
  auVar20 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)alpn_proto);
  s_00._M_str = auVar20._8_8_;
  s_00._M_len = (size_t)s_00._M_str;
  lhs = bssl::StringAsBytes(auVar20._0_8_,s_00);
  bssl::Span<const_unsigned_char>::Span
            ((Span<const_unsigned_char> *)((long)&expect_settings.field_2 + 8),puStack_90,
             (ulong)local_94);
  bVar5 = bssl::internal::operator!=(lhs,stack0xffffffffffffff38);
  if (bVar5) {
    fprintf(_stderr,"negotiated alpn proto mismatch\n");
    ssl_local._7_1_ = 0;
    goto LAB_00123c5b;
  }
  uVar8 = SSL_has_application_settings((SSL *)pSStack_18);
  bVar5 = std::optional::operator_cast_to_bool((optional *)&state[4].private_key_retries);
  pFVar3 = _stderr;
  if (uVar8 != bVar5) {
    iVar9 = SSL_has_application_settings((SSL *)pSStack_18);
    pcVar19 = "does not have";
    if (iVar9 != 0) {
      pcVar19 = "has";
    }
    fprintf(pFVar3,"connection %s application settings, but expected the opposite\n",pcVar19);
    ssl_local._7_1_ = 0;
    goto LAB_00123c5b;
  }
  bVar5 = std::optional::operator_cast_to_bool((optional *)&state[4].private_key_retries);
  local_ea = 0;
  if (bVar5) {
    pbVar13 = std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&state[4].private_key_retries);
    std::__cxx11::string::string(local_e8,(string *)pbVar13);
  }
  else {
    std::allocator<char>::allocator();
    local_ea = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_e8,"",&local_e9);
  }
  if ((local_ea & 1) != 0) {
    std::allocator<char>::~allocator(&local_e9);
  }
  SSL_get0_peer_application_settings((SSL *)pSStack_18,(uint8_t **)&peer_settings_len,&local_110);
  local_130 = std::__cxx11::string::operator_cast_to_basic_string_view(local_e8);
  s_01._M_str = local_130._8_8_;
  s_01._M_len = (size_t)s_01._M_str;
  local_120 = bssl::StringAsBytes(local_130._0_8_,s_01);
  bssl::Span<const_unsigned_char>::Span(&local_140,(uchar *)peer_settings_len,local_110);
  bVar5 = bssl::internal::operator!=(local_120,local_140);
  if (bVar5) {
    fprintf(_stderr,"peer application settings mismatch\n");
    ssl_local._7_1_ = 0;
  }
  else {
    bVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)&state[4].get_handshake_hints_cb.super__Function_base._M_functor + 8))
    ;
    if ((!bVar5) && ((server_name._6_1_ & 1) != 0)) {
      SSL_get_peer_quic_transport_params((SSL *)pSStack_18,(uint8_t **)&peer_params_len,&local_158);
      bssl::Span<unsigned_char_const>::
      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<unsigned_char_const> *)&local_168,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&state[4].get_handshake_hints_cb.super__Function_base._M_functor + 8));
      bssl::Span<const_unsigned_char>::Span
                ((Span<const_unsigned_char> *)(channel_id + 0x38),(uchar *)peer_params_len,local_158
                );
      bVar5 = bssl::internal::operator!=(local_168,stack0xfffffffffffffe88);
      if (bVar5) {
        fprintf(_stderr,"QUIC transport params mismatch\n");
        ssl_local._7_1_ = 0;
        goto LAB_00123c4f;
      }
    }
    bVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&state[3].session);
    if (bVar5) {
LAB_00122e54:
      if ((state[4].selected_credential & 0x100) != 0) {
        iVar9 = SSL_get_extms_support((SSL *)pSStack_18);
        if (iVar9 == 0) {
          fprintf(_stderr,"No EMS for connection when expected\n");
          ssl_local._7_1_ = 0;
          goto LAB_00123c4f;
        }
      }
      if ((state[7].msg_callback_text.field_0x7 & 1) != 0) {
        iVar9 = SSL_get_secure_renegotiation_support((SSL *)pSStack_18);
        if (iVar9 == 0) {
          fprintf(_stderr,"No secure renegotiation for connection when expected\n");
          ssl_local._7_1_ = 0;
          goto LAB_00123c4f;
        }
      }
      if ((state[7].msg_callback_text._M_string_length & 1) != 0) {
        iVar9 = SSL_get_secure_renegotiation_support((SSL *)pSStack_18);
        if (iVar9 != 0) {
          fprintf(_stderr,"Secure renegotiation unexpectedly negotiated for connection\n");
          ssl_local._7_1_ = 0;
          goto LAB_00123c4f;
        }
      }
      if (*(short *)((long)&state[6].get_handshake_hints_cb.super__Function_base._M_functor + 10) !=
          0) {
        uVar6 = *(uint16_t *)
                 ((long)&state[6].get_handshake_hints_cb.super__Function_base._M_functor + 10);
        uVar7 = SSL_get_peer_signature_algorithm((SSL *)pSStack_18);
        pFVar3 = _stderr;
        if (uVar6 != uVar7) {
          uVar6 = SSL_get_peer_signature_algorithm((SSL *)pSStack_18);
          fprintf(pFVar3,"Peer signature algorithm was %04x, wanted %04x.\n",(ulong)uVar6,
                  (ulong)*(ushort *)
                          ((long)&state[6].get_handshake_hints_cb.super__Function_base._M_functor +
                          10));
          ssl_local._7_1_ = 0;
          goto LAB_00123c4f;
        }
      }
      if (*(short *)((long)&state[6].get_handshake_hints_cb.super__Function_base._M_functor + 0xc)
          != 0) {
        uVar6 = SSL_get_curve_id((SSL *)pSStack_18);
        if (*(uint16_t *)
             ((long)&state[6].get_handshake_hints_cb.super__Function_base._M_functor + 0xc) != uVar6
           ) {
          fprintf(_stderr,"curve_id was %04x, wanted %04x\n",(ulong)uVar6,
                  (ulong)*(ushort *)
                          ((long)&state[6].get_handshake_hints_cb.super__Function_base._M_functor +
                          0xc));
          ssl_local._7_1_ = 0;
          goto LAB_00123c4f;
        }
      }
      pSVar11 = SSL_get_current_cipher(pSStack_18);
      uVar6 = SSL_CIPHER_get_protocol_id((SSL_CIPHER *)pSVar11);
      if (*(short *)((long)&state[7].private_key_result.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 2) != 0) {
        iVar9 = EVP_has_aes_hardware();
        if ((iVar9 != 0) &&
           (*(uint16_t *)
             ((long)&state[7].private_key_result.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish + 2) != uVar6)) {
          fprintf(_stderr,"Cipher ID was %04x, wanted %04x (has AES hardware)\n",(ulong)uVar6,
                  (ulong)*(ushort *)
                          ((long)&state[7].private_key_result.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 2));
          ssl_local._7_1_ = 0;
          goto LAB_00123c4f;
        }
      }
      if (*(short *)((long)&state[7].private_key_result.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 4) != 0) {
        iVar9 = EVP_has_aes_hardware();
        if ((iVar9 == 0) &&
           (*(uint16_t *)
             ((long)&state[7].private_key_result.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4) != uVar6)) {
          fprintf(_stderr,"Cipher ID was %04x, wanted %04x (no AES hardware)\n",(ulong)uVar6,
                  (ulong)*(ushort *)
                          ((long)&state[7].private_key_result.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 4));
          ssl_local._7_1_ = 0;
          goto LAB_00123c4f;
        }
      }
      if ((*(short *)((long)&state[7].private_key_result.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 6) == 0) ||
         (*(uint16_t *)
           ((long)&state[7].private_key_result.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish + 6) == uVar6)) {
        iVar9 = SSL_in_early_data((SSL *)pSStack_18);
        if (iVar9 == 0) {
          iVar9 = SSL_is_dtls((SSL *)pSStack_18);
          if (iVar9 == 0) {
            if (((ulong)state[6].private_key_result.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 0x10000000000) != 0) {
              iVar9 = SSL_early_data_accepted((SSL *)pSStack_18);
              if (iVar9 != 0) goto LAB_00123277;
LAB_001232a4:
              pFVar3 = _stderr;
              iVar9 = SSL_early_data_accepted((SSL *)pSStack_18);
              pcVar19 = " not";
              if (iVar9 != 0) {
                pcVar19 = "";
              }
              fprintf(pFVar3,"Early data was%s accepted, but we expected the opposite\n",pcVar19);
              ssl_local._7_1_ = 0;
              goto LAB_00123c4f;
            }
LAB_00123277:
            if (((ulong)state[6].private_key_result.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 0x1000000000000) != 0) {
              iVar9 = SSL_early_data_accepted((SSL *)pSStack_18);
              if (iVar9 != 0) goto LAB_001232a4;
            }
            reason = SSL_get_early_data_reason((SSL *)pSStack_18);
            pcVar19 = SSL_early_data_reason_string(reason);
            uVar12 = std::__cxx11::string::empty();
            if ((uVar12 & 1) == 0) {
              bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&state[8].early_callback_called,pcVar19);
              pFVar3 = _stderr;
              if (bVar5) {
                uVar15 = std::__cxx11::string::c_str();
                fprintf(pFVar3,"Early data reason was \"%s\", expected \"%s\"\n",pcVar19,uVar15);
                ssl_local._7_1_ = 0;
                goto LAB_00123c4f;
              }
            }
          }
        }
        iVar9 = SSL_is_dtls((SSL *)pSStack_18);
        if (iVar9 != 0) {
          iVar9 = SSL_in_early_data((SSL *)pSStack_18);
          if (iVar9 != 0) {
            fprintf(_stderr,"DTLS unexpectedly in early data\n");
            ssl_local._7_1_ = 0;
            goto LAB_00123c4f;
          }
        }
        uVar12 = std::__cxx11::string::empty();
        if ((uVar12 & 1) == 0) {
          psVar16 = SSL_get_peer_cert_chain(pSStack_18);
          if (psVar16 != (stack_st_X509 *)0x0) {
            fprintf(_stderr,"Received peer certificate on a PSK cipher.\n");
            ssl_local._7_1_ = 0;
            goto LAB_00123c4f;
          }
        }
        else {
          bVar5 = IsPAKE((SSL *)pSStack_18);
          if (bVar5) {
            psVar16 = SSL_get_peer_cert_chain(pSStack_18);
            if (psVar16 != (stack_st_X509 *)0x0) {
              fprintf(_stderr,"Received peer certificate on a PAKE handshake.\n");
              ssl_local._7_1_ = 0;
              goto LAB_00123c4f;
            }
          }
          else if ((((ulong)(state->quic_transport)._M_t.
                            super___uniq_ptr_impl<MockQuicTransport,_std::default_delete<MockQuicTransport>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_MockQuicTransport_*,_std::default_delete<MockQuicTransport>_>
                            .super__Head_base<0UL,_MockQuicTransport_*,_false>._M_head_impl & 1) ==
                    0) || ((state[2].private_key_retries & 1) != 0)) {
            psVar16 = SSL_get_peer_cert_chain(pSStack_18);
            if (psVar16 == (stack_st_X509 *)0x0) {
              fprintf(_stderr,"Received no peer certificate but expected one.\n");
              ssl_local._7_1_ = 0;
              goto LAB_00123c4f;
            }
          }
        }
        if (((config_local._7_1_ & 1) != 0) &&
           (*(int *)((long)&state[7].msg_callback_text.field_2 + 8) != 0)) {
          iVar10 = SSL_get_ticket_age_skew((SSL *)pSStack_18);
          pFVar3 = _stderr;
          if (iVar10 != *(int *)((long)&state[7].msg_callback_text.field_2 + 8)) {
            uVar8 = SSL_get_ticket_age_skew((SSL *)pSStack_18);
            fprintf(pFVar3,"Ticket age skew was %d, wanted %d\n",(ulong)uVar8,
                    (ulong)*(uint *)((long)&state[7].msg_callback_text.field_2 + 8));
            ssl_local._7_1_ = 0;
            goto LAB_00123c4f;
          }
        }
        bVar5 = std::optional<int>::has_value((optional<int> *)(state + 9));
        if (bVar5) {
          piVar17 = std::optional<int>::operator*((optional<int> *)(state + 9));
          pFVar3 = _stderr;
          if (*piVar17 != pTStack_30->selected_credential) {
            uVar8 = pTStack_30->selected_credential;
            puVar18 = (uint *)std::optional<int>::operator*((optional<int> *)(state + 9));
            fprintf(pFVar3,"Credential %d was used, wanted %d\n",(ulong)uVar8,(ulong)*puVar18);
            ssl_local._7_1_ = 0;
            goto LAB_00123c4f;
          }
        }
        if (((ulong)state[8].private_key_result.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish & 1) == 0) {
LAB_001236ca:
          if (((ulong)state[8].private_key_result.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish & 0x100) != 0) {
            iVar9 = SSL_used_hello_retry_request((SSL *)pSStack_18);
            if (iVar9 != 0) goto LAB_001236f7;
          }
          bVar1 = state[1].get_handshake_hints_cb.super__Function_base._M_functor._M_pod_data[8];
          iVar9 = SSL_ech_accepted((SSL *)pSStack_18);
          pFVar3 = _stderr;
          if ((bool)(bVar1 & 1) == (iVar9 != 0)) {
            bVar1 = *(byte *)((long)&state[8].async_bio + 2);
            iVar9 = SSL_was_key_usage_invalid((SSL *)pSStack_18);
            pFVar3 = _stderr;
            if ((bool)(bVar1 & 1) == (iVar9 != 0)) {
              pcVar19 = SSL_get_version(pSStack_18);
              bVar5 = CheckListContains("version",SSL_get_all_version_names,pcVar19);
              if (bVar5) {
                pSVar11 = SSL_get_current_cipher(pSStack_18);
                pcVar19 = SSL_CIPHER_standard_name((SSL_CIPHER *)pSVar11);
                bVar5 = CheckListContains("cipher",SSL_get_all_standard_cipher_names,pcVar19);
                if (bVar5) {
                  pSVar11 = SSL_get_current_cipher(pSStack_18);
                  pcVar19 = SSL_CIPHER_get_name(pSVar11);
                  bVar5 = CheckListContains("OpenSSL cipher name",SSL_get_all_cipher_names,pcVar19);
                  if (bVar5) {
                    uVar6 = SSL_get_group_id((SSL *)pSStack_18);
                    if (uVar6 != 0) {
                      uVar6 = SSL_get_group_id((SSL *)pSStack_18);
                      pcVar19 = SSL_get_group_name(uVar6);
                      bVar5 = CheckListContains("group",SSL_get_all_group_names,pcVar19);
                      if (!bVar5) goto LAB_00123b1c;
                    }
                    uVar6 = SSL_get_peer_signature_algorithm((SSL *)pSStack_18);
                    if (uVar6 != 0) {
                      uVar6 = SSL_get_peer_signature_algorithm((SSL *)pSStack_18);
                      pcVar19 = SSL_get_signature_algorithm_name(uVar6,0);
                      bVar5 = CheckListContains("sigalg",SSL_get_all_signature_algorithm_names,
                                                pcVar19);
                      if (!bVar5) goto LAB_00123b1c;
                    }
                    uVar6 = SSL_get_peer_signature_algorithm((SSL *)pSStack_18);
                    if (uVar6 != 0) {
                      uVar6 = SSL_get_peer_signature_algorithm((SSL *)pSStack_18);
                      pcVar19 = SSL_get_signature_algorithm_name(uVar6,1);
                      bVar5 = CheckListContains("sigalg with curve",
                                                SSL_get_all_signature_algorithm_names,pcVar19);
                      if (!bVar5) goto LAB_00123b1c;
                    }
                    if ((((ulong)state[7].get_handshake_hints_cb._M_invoker & 0x10000) == 0) ||
                       (((ulong)state[7].get_handshake_hints_cb._M_invoker & 0x1000000) != 0)) {
LAB_00123c41:
                      ssl_local._7_1_ = 1;
                    }
                    else {
                      iVar9 = SSL_version(pSStack_18);
                      if (iVar9 == 0x304) {
                        iVar9 = SSL_used_hello_retry_request((SSL *)pSStack_18);
                        bVar5 = iVar9 != 0;
                      }
                      else {
                        pSVar11 = SSL_get_current_cipher(pSStack_18);
                        iVar9 = SSL_CIPHER_get_kx_nid((SSL_CIPHER *)pSVar11);
                        bVar5 = iVar9 == 0x3b7;
                      }
                      if ((bVar5) || ((pTStack_30->used_private_key & 1U) == 0)) {
                        if ((pTStack_30->ticket_decrypt_done & 1U) == 0) goto LAB_00123c41;
                        fprintf(_stderr,
                                "Performed ticket decryption, but hint should have skipped it\n");
                        ssl_local._7_1_ = 0;
                      }
                      else {
                        fprintf(_stderr,
                                "Performed private key operation, but hint should have skipped it\n"
                               );
                        ssl_local._7_1_ = 0;
                      }
                    }
                    goto LAB_00123c4f;
                  }
                }
              }
LAB_00123b1c:
              ssl_local._7_1_ = 0;
            }
            else {
              iVar9 = SSL_was_key_usage_invalid((SSL *)pSStack_18);
              pcVar19 = "";
              if (iVar9 != 0) {
                pcVar19 = "in";
              }
              fprintf(pFVar3,"X.509 key usage was %svalid, but wanted opposite.\n",pcVar19);
              ssl_local._7_1_ = 0;
            }
          }
          else {
            iVar9 = SSL_ech_accepted((SSL *)pSStack_18);
            pcVar19 = "not ";
            if (iVar9 != 0) {
              pcVar19 = "";
            }
            fprintf(pFVar3,"ECH was %saccepted, but wanted opposite.\n",pcVar19);
            ssl_local._7_1_ = 0;
          }
        }
        else {
          iVar9 = SSL_used_hello_retry_request((SSL *)pSStack_18);
          if (iVar9 != 0) goto LAB_001236ca;
LAB_001236f7:
          pFVar3 = _stderr;
          iVar9 = SSL_used_hello_retry_request((SSL *)pSStack_18);
          pcVar19 = "no ";
          if (iVar9 != 0) {
            pcVar19 = "";
          }
          fprintf(pFVar3,"Got %sHRR, but wanted opposite.\n",pcVar19);
          ssl_local._7_1_ = 0;
        }
      }
      else {
        fprintf(_stderr,"Cipher ID was %04x, wanted %04x\n",(ulong)uVar6,
                (ulong)*(ushort *)
                        ((long)&state[7].private_key_result.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 6));
        ssl_local._7_1_ = 0;
      }
    }
    else {
      sVar14 = SSL_get_tls_channel_id((SSL *)pSStack_18,local_1b8,0x40);
      if (sVar14 == 0) {
        fprintf(_stderr,"no channel id negotiated\n");
        ssl_local._7_1_ = 0;
      }
      else {
        bssl::Span<unsigned_char_const>::
        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<unsigned_char_const> *)&local_1c8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&state[3].session);
        bssl::Span<unsigned_char_const>::Span<64ul>
                  ((Span<unsigned_char_const> *)auStack_1d8,(uchar (*) [64])local_1b8);
        bVar5 = bssl::internal::operator!=(local_1c8,_auStack_1d8);
        if (!bVar5) goto LAB_00122e54;
        fprintf(_stderr,"channel id mismatch\n");
        ssl_local._7_1_ = 0;
      }
    }
  }
LAB_00123c4f:
  peer_params._4_4_ = 1;
  std::__cxx11::string::~string(local_e8);
LAB_00123c5b:
  return (bool)(ssl_local._7_1_ & 1);
}

Assistant:

static bool CheckHandshakeProperties(SSL *ssl, bool is_resume,
                                     const TestConfig *config) {
  TestState *state = GetTestState(ssl);
  if (!CheckAuthProperties(ssl, is_resume, config)) {
    return false;
  }

  if (SSL_get_current_cipher(ssl) == nullptr) {
    fprintf(stderr, "null cipher after handshake\n");
    return false;
  }

  if (config->expect_version != 0 &&
      SSL_version(ssl) != int{config->expect_version}) {
    fprintf(stderr, "want version %04x, got %04x\n", config->expect_version,
            static_cast<uint16_t>(SSL_version(ssl)));
    return false;
  }

  bool expect_resume =
      is_resume && (!config->expect_session_miss || SSL_in_early_data(ssl));
  if (!!SSL_session_reused(ssl) != expect_resume) {
    fprintf(stderr, "session unexpectedly was%s reused\n",
            SSL_session_reused(ssl) ? "" : " not");
    return false;
  }

  bool expect_handshake_done =
      (is_resume || !config->false_start) && !SSL_in_early_data(ssl);
  if (expect_handshake_done != state->handshake_done) {
    fprintf(stderr, "handshake was%s completed\n",
            state->handshake_done ? "" : " not");
    return false;
  }

  if (expect_handshake_done && !config->is_server) {
    bool expect_new_session =
        !config->expect_no_session &&
        (!SSL_session_reused(ssl) || config->expect_ticket_renewal) &&
        // Session tickets are sent post-handshake in TLS 1.3.
        GetProtocolVersion(ssl) < TLS1_3_VERSION;
    if (expect_new_session != state->got_new_session) {
      fprintf(stderr,
              "new session was%s cached, but we expected the opposite\n",
              state->got_new_session ? "" : " not");
      return false;
    }
  }

  if (!is_resume) {
    if (config->expect_session_id && !state->got_new_session) {
      fprintf(stderr, "session was not cached on the server.\n");
      return false;
    }
    if (config->expect_no_session_id && state->got_new_session) {
      fprintf(stderr, "session was unexpectedly cached on the server.\n");
      return false;
    }
  }

  // early_callback_called is updated in the handshaker, so we don't see it
  // here.
  if (!config->handoff && config->is_server && !state->early_callback_called) {
    fprintf(stderr, "early callback not called\n");
    return false;
  }

  if (!config->expect_server_name.empty()) {
    const char *server_name =
        SSL_get_servername(ssl, TLSEXT_NAMETYPE_host_name);
    if (server_name == nullptr || server_name != config->expect_server_name) {
      fprintf(stderr, "servername mismatch (got %s; want %s)\n", server_name,
              config->expect_server_name.c_str());
      return false;
    }
  }

  if (!config->expect_next_proto.empty() || config->expect_no_next_proto) {
    const uint8_t *next_proto;
    unsigned next_proto_len;
    SSL_get0_next_proto_negotiated(ssl, &next_proto, &next_proto_len);
    if (bssl::StringAsBytes(config->expect_next_proto) !=
        bssl::Span(next_proto, next_proto_len)) {
      fprintf(stderr, "negotiated next proto mismatch\n");
      return false;
    }
  }

  // On the server, the protocol selected in the ALPN callback must be echoed
  // out of |SSL_get0_alpn_selected|. On the client, it should report what the
  // test expected.
  const std::string &expect_alpn =
      config->is_server ? config->select_alpn : config->expect_alpn;
  const uint8_t *alpn_proto;
  unsigned alpn_proto_len;
  SSL_get0_alpn_selected(ssl, &alpn_proto, &alpn_proto_len);
  if (bssl::StringAsBytes(expect_alpn) !=
      bssl::Span(alpn_proto, alpn_proto_len)) {
    fprintf(stderr, "negotiated alpn proto mismatch\n");
    return false;
  }

  if (SSL_has_application_settings(ssl) !=
      (config->expect_peer_application_settings ? 1 : 0)) {
    fprintf(stderr,
            "connection %s application settings, but expected the opposite\n",
            SSL_has_application_settings(ssl) ? "has" : "does not have");
    return false;
  }
  std::string expect_settings = config->expect_peer_application_settings
                                    ? *config->expect_peer_application_settings
                                    : "";
  const uint8_t *peer_settings;
  size_t peer_settings_len;
  SSL_get0_peer_application_settings(ssl, &peer_settings, &peer_settings_len);
  if (bssl::StringAsBytes(expect_settings) !=
      bssl::Span(peer_settings, peer_settings_len)) {
    fprintf(stderr, "peer application settings mismatch\n");
    return false;
  }

  if (!config->expect_quic_transport_params.empty() && expect_handshake_done) {
    const uint8_t *peer_params;
    size_t peer_params_len;
    SSL_get_peer_quic_transport_params(ssl, &peer_params, &peer_params_len);
    if (bssl::Span(config->expect_quic_transport_params) !=
        bssl::Span(peer_params, peer_params_len)) {
      fprintf(stderr, "QUIC transport params mismatch\n");
      return false;
    }
  }

  if (!config->expect_channel_id.empty()) {
    uint8_t channel_id[64];
    if (!SSL_get_tls_channel_id(ssl, channel_id, sizeof(channel_id))) {
      fprintf(stderr, "no channel id negotiated\n");
      return false;
    }
    if (bssl::Span(config->expect_channel_id) != channel_id) {
      fprintf(stderr, "channel id mismatch\n");
      return false;
    }
  }

  if (config->expect_extended_master_secret && !SSL_get_extms_support(ssl)) {
    fprintf(stderr, "No EMS for connection when expected\n");
    return false;
  }

  if (config->expect_secure_renegotiation &&
      !SSL_get_secure_renegotiation_support(ssl)) {
    fprintf(stderr, "No secure renegotiation for connection when expected\n");
    return false;
  }

  if (config->expect_no_secure_renegotiation &&
      SSL_get_secure_renegotiation_support(ssl)) {
    fprintf(stderr,
            "Secure renegotiation unexpectedly negotiated for connection\n");
    return false;
  }

  if (config->expect_peer_signature_algorithm != 0 &&
      config->expect_peer_signature_algorithm !=
          SSL_get_peer_signature_algorithm(ssl)) {
    fprintf(stderr, "Peer signature algorithm was %04x, wanted %04x.\n",
            SSL_get_peer_signature_algorithm(ssl),
            config->expect_peer_signature_algorithm);
    return false;
  }

  if (config->expect_curve_id != 0) {
    uint16_t curve_id = SSL_get_curve_id(ssl);
    if (config->expect_curve_id != curve_id) {
      fprintf(stderr, "curve_id was %04x, wanted %04x\n", curve_id,
              config->expect_curve_id);
      return false;
    }
  }

  uint16_t cipher_id = SSL_CIPHER_get_protocol_id(SSL_get_current_cipher(ssl));
  if (config->expect_cipher_aes != 0 && EVP_has_aes_hardware() &&
      config->expect_cipher_aes != cipher_id) {
    fprintf(stderr, "Cipher ID was %04x, wanted %04x (has AES hardware)\n",
            cipher_id, config->expect_cipher_aes);
    return false;
  }

  if (config->expect_cipher_no_aes != 0 && !EVP_has_aes_hardware() &&
      config->expect_cipher_no_aes != cipher_id) {
    fprintf(stderr, "Cipher ID was %04x, wanted %04x (no AES hardware)\n",
            cipher_id, config->expect_cipher_no_aes);
    return false;
  }

  if (config->expect_cipher != 0 && config->expect_cipher != cipher_id) {
    fprintf(stderr, "Cipher ID was %04x, wanted %04x\n", cipher_id,
            config->expect_cipher);
    return false;
  }

  // The early data status is only applicable after the handshake is confirmed.
  if (!SSL_in_early_data(ssl) && !SSL_is_dtls(ssl)) {
    if ((config->expect_accept_early_data && !SSL_early_data_accepted(ssl)) ||
        (config->expect_reject_early_data && SSL_early_data_accepted(ssl))) {
      fprintf(stderr,
              "Early data was%s accepted, but we expected the opposite\n",
              SSL_early_data_accepted(ssl) ? "" : " not");
      return false;
    }

    const char *early_data_reason =
        SSL_early_data_reason_string(SSL_get_early_data_reason(ssl));
    if (!config->expect_early_data_reason.empty() &&
        config->expect_early_data_reason != early_data_reason) {
      fprintf(stderr, "Early data reason was \"%s\", expected \"%s\"\n",
              early_data_reason, config->expect_early_data_reason.c_str());
      return false;
    }
  }

  if (SSL_is_dtls(ssl) && SSL_in_early_data(ssl)) {
    // TODO(crbug.com/381113363): Support early data for DTLS 1.3.
    fprintf(stderr, "DTLS unexpectedly in early data\n");
    return false;
  }

  if (!config->psk.empty()) {
    if (SSL_get_peer_cert_chain(ssl) != nullptr) {
      fprintf(stderr, "Received peer certificate on a PSK cipher.\n");
      return false;
    }
  } else if (IsPAKE(ssl)) {
    if (SSL_get_peer_cert_chain(ssl) != nullptr) {
      fprintf(stderr, "Received peer certificate on a PAKE handshake.\n");
      return false;
    }
  } else if (!config->is_server || config->require_any_client_certificate) {
    if (SSL_get_peer_cert_chain(ssl) == nullptr) {
      fprintf(stderr, "Received no peer certificate but expected one.\n");
      return false;
    }
  }

  if (is_resume && config->expect_ticket_age_skew != 0 &&
      SSL_get_ticket_age_skew(ssl) != config->expect_ticket_age_skew) {
    fprintf(stderr, "Ticket age skew was %" PRId32 ", wanted %d\n",
            SSL_get_ticket_age_skew(ssl), config->expect_ticket_age_skew);
    return false;
  }

  if (config->expect_selected_credential.has_value() &&
      *config->expect_selected_credential != state->selected_credential) {
    fprintf(stderr, "Credential %d was used, wanted %d\n",
            state->selected_credential, *config->expect_selected_credential);
    return false;
  }

  if ((config->expect_hrr && !SSL_used_hello_retry_request(ssl)) ||
      (config->expect_no_hrr && SSL_used_hello_retry_request(ssl))) {
    fprintf(stderr, "Got %sHRR, but wanted opposite.\n",
            SSL_used_hello_retry_request(ssl) ? "" : "no ");
    return false;
  }

  if (config->expect_ech_accept != !!SSL_ech_accepted(ssl)) {
    fprintf(stderr, "ECH was %saccepted, but wanted opposite.\n",
            SSL_ech_accepted(ssl) ? "" : "not ");
    return false;
  }

  if (config->expect_key_usage_invalid != !!SSL_was_key_usage_invalid(ssl)) {
    fprintf(stderr, "X.509 key usage was %svalid, but wanted opposite.\n",
            SSL_was_key_usage_invalid(ssl) ? "in" : "");
    return false;
  }

  // Check all the selected parameters are covered by the string APIs.
  if (!CheckListContains("version", SSL_get_all_version_names,
                         SSL_get_version(ssl)) ||
      !CheckListContains(
          "cipher", SSL_get_all_standard_cipher_names,
          SSL_CIPHER_standard_name(SSL_get_current_cipher(ssl))) ||
      !CheckListContains("OpenSSL cipher name", SSL_get_all_cipher_names,
                         SSL_CIPHER_get_name(SSL_get_current_cipher(ssl))) ||
      (SSL_get_group_id(ssl) != 0 &&
       !CheckListContains("group", SSL_get_all_group_names,
                          SSL_get_group_name(SSL_get_group_id(ssl)))) ||
      (SSL_get_peer_signature_algorithm(ssl) != 0 &&
       !CheckListContains(
           "sigalg", SSL_get_all_signature_algorithm_names,
           SSL_get_signature_algorithm_name(
               SSL_get_peer_signature_algorithm(ssl), /*include_curve=*/0))) ||
      (SSL_get_peer_signature_algorithm(ssl) != 0 &&
       !CheckListContains(
           "sigalg with curve", SSL_get_all_signature_algorithm_names,
           SSL_get_signature_algorithm_name(
               SSL_get_peer_signature_algorithm(ssl), /*include_curve=*/1)))) {
    return false;
  }

  // Test that handshake hints correctly skipped the expected operations.
  if (config->handshake_hints && !config->allow_hint_mismatch) {
    // If the private key operation is performed in the first roundtrip, a hint
    // match should have skipped it. This is ECDHE-based cipher suites in TLS
    // 1.2 and non-HRR handshakes in TLS 1.3.
    bool private_key_allowed;
    if (SSL_version(ssl) == TLS1_3_VERSION) {
      private_key_allowed = SSL_used_hello_retry_request(ssl);
    } else {
      private_key_allowed =
          SSL_CIPHER_get_kx_nid(SSL_get_current_cipher(ssl)) == NID_kx_rsa;
    }
    if (!private_key_allowed && state->used_private_key) {
      fprintf(
          stderr,
          "Performed private key operation, but hint should have skipped it\n");
      return false;
    }

    if (state->ticket_decrypt_done) {
      fprintf(stderr,
              "Performed ticket decryption, but hint should have skipped it\n");
      return false;
    }

    // TODO(davidben): Decide what we want to do with TLS 1.2 stateful
    // resumption.
  }
  return true;
}